

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::SpectrumImageTexture::Evaluate
          (SpectrumImageTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  Float FVar1;
  RGBColorSpace *cs;
  float fVar2;
  anon_class_24_3_48d30edf func;
  long lVar3;
  float *__result;
  RGBSpectrum *pRVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined8 uVar9;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar13 [56];
  undefined1 auVar12 [64];
  undefined1 auVar14 [16];
  RGB RVar15;
  SampledSpectrum SVar16;
  undefined8 local_b8;
  Tuple2<pbrt::Point2,_float> *pTStack_b0;
  Tuple2<pbrt::Vector2,_float> **local_a8;
  Tuple2<pbrt::Point2,_float> local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  Tuple2<pbrt::Vector2,_float> local_80;
  Tuple2<pbrt::Vector2,_float> local_78;
  Tuple2<pbrt::Vector2,_float> *local_70;
  RGBSpectrum local_68;
  float fStack_40;
  Float FStack_3c;
  Float FStack_38;
  Float FStack_34;
  Float FStack_30;
  int iStack_2c;
  undefined1 extraout_var [56];
  undefined1 auVar10 [56];
  undefined1 auVar11 [64];
  
  if ((this->super_ImageTextureBase).mipmap == (MIPMap *)0x0) {
    FVar1 = (this->super_ImageTextureBase).scale;
    auVar5._4_4_ = FVar1;
    auVar5._0_4_ = FVar1;
    auVar5._8_4_ = FVar1;
    auVar5._12_4_ = FVar1;
  }
  else {
    local_a0 = (Tuple2<pbrt::Point2,_float>)&local_78;
    local_78.x = 0.0;
    local_78.y = 0.0;
    local_70 = &local_80;
    local_80.x = 0.0;
    local_80.y = 0.0;
    pRVar4 = &local_68;
    local_68.rgb.r = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
    local_68.rgb.g = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
    local_68.rgb.b = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
    local_68.scale = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
    local_68.rsp.c0 = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
    local_68.rsp.c1 = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
    local_68.rsp.c2 = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
    local_68._28_4_ = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
    local_68.illuminant = (DenselySampledSpectrum *)ctx._32_8_;
    fStack_40 = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
    FStack_3c = ctx.dudx;
    FStack_38 = ctx.dudy;
    FStack_34 = ctx.dvdx;
    FStack_30 = ctx.dvdy;
    iStack_2c = ctx.faceIndex;
    pTStack_b0 = &local_a0;
    local_a8 = &local_70;
    func.dstdx = (Vector2f **)pTStack_b0;
    func.ctx = (TextureEvalContext *)pRVar4;
    func.dstdy = (Vector2f **)local_a8;
    local_b8 = pRVar4;
    auVar6._0_8_ = TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                   ::
                   Dispatch<pbrt::TextureMapping2DHandle::Map(pbrt::TextureEvalContext,pbrt::Vector2<float>*,pbrt::Vector2<float>*)const::_lambda(auto:1)_1_>
                             ((TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                               *)this,func);
    auVar6._8_56_ = extraout_var;
    uVar9 = vmovlps_avx(auVar6._0_16_);
    local_a0.y = (float)((ulong)uVar9 >> 0x20);
    local_a0.x = (float)uVar9;
    local_a0.y = 1.0 - local_a0.y;
    uVar9 = 0;
    local_98 = (this->super_ImageTextureBase).scale;
    fStack_94 = local_98;
    fStack_90 = local_98;
    fStack_8c = local_98;
    RVar15 = MIPMap::Lookup<pbrt::RGB>
                       ((this->super_ImageTextureBase).mipmap,(Point2f *)&local_a0,
                        (Vector2f)local_78,(Vector2f)local_80);
    auVar14._0_4_ = local_98 * RVar15.r;
    auVar14._4_4_ = fStack_94 * RVar15.g;
    auVar14._8_4_ = fStack_90 * (float)uVar9;
    auVar14._12_4_ = fStack_8c * (float)((ulong)uVar9 >> 0x20);
    fVar2 = local_98 * RVar15.b;
    local_b8 = (RGBSpectrum *)vmovlps_avx(auVar14);
    pTStack_b0 = (Tuple2<pbrt::Point2,_float> *)CONCAT44(pTStack_b0._4_4_,fVar2);
    cs = ((this->super_ImageTextureBase).mipmap)->colorSpace;
    if (cs == (RGBColorSpace *)0x0) {
      if ((((float)local_b8 != local_b8._4_4_) || (local_b8._4_4_ != fVar2)) ||
         (NAN(local_b8._4_4_) || NAN(fVar2))) {
        LogFatal<char_const(&)[37]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/textures.cpp"
                   ,0x1ba,"Check failed: %s",(char (*) [37])"rgb[0] == rgb[1] && rgb[1] == rgb[2]");
      }
      auVar5._4_4_ = (float)local_b8;
      auVar5._0_4_ = (float)local_b8;
      auVar5._8_4_ = (float)local_b8;
      auVar5._12_4_ = (float)local_b8;
    }
    else {
      auVar13 = ZEXT856(0);
      local_68.rgb.r = SUB84(local_b8,0);
      local_68.rgb.g = SUB84(local_b8,4);
      local_68.rgb.b = fVar2;
      lVar3 = 4;
      do {
        if ((pRVar4->rgb).r < *(float *)((long)&local_68.rgb.r + lVar3)) {
          pRVar4 = (RGBSpectrum *)((long)&local_68.rgb.r + lVar3);
        }
        lVar3 = lVar3 + 4;
      } while (lVar3 != 0xc);
      auVar10 = (undefined1  [56])0x0;
      if ((pRVar4->rgb).r <= 1.0) {
        RGBReflectanceSpectrum::RGBReflectanceSpectrum
                  ((RGBReflectanceSpectrum *)&local_68,cs,(RGB *)&local_b8);
        SVar16 = RGBReflectanceSpectrum::Sample((RGBReflectanceSpectrum *)&local_68,&lambda);
        auVar12._0_8_ = SVar16.values.values._8_8_;
        auVar12._8_56_ = auVar13;
        auVar14 = auVar12._0_16_;
        auVar8._0_8_ = SVar16.values.values._0_8_;
        auVar8._8_56_ = auVar10;
        auVar5 = auVar8._0_16_;
      }
      else {
        RGBSpectrum::RGBSpectrum(&local_68,cs,(RGB *)&local_b8);
        SVar16 = RGBSpectrum::Sample(&local_68,&lambda);
        auVar11._0_8_ = SVar16.values.values._8_8_;
        auVar11._8_56_ = auVar13;
        auVar14 = auVar11._0_16_;
        auVar7._0_8_ = SVar16.values.values._0_8_;
        auVar7._8_56_ = auVar10;
        auVar5 = auVar7._0_16_;
      }
      auVar5 = vmovlhps_avx(auVar5,auVar14);
    }
  }
  auVar14 = vshufpd_avx(auVar5,auVar5,1);
  SVar16.values.values._0_8_ = auVar5._0_8_;
  SVar16.values.values._8_8_ = auVar14._0_8_;
  return (SampledSpectrum)SVar16.values.values;
}

Assistant:

SampledSpectrum SpectrumImageTexture::Evaluate(TextureEvalContext ctx,
                                               SampledWavelengths lambda) const {
#ifdef PBRT_IS_GPU_CODE
    assert(!"Should not be called in GPU code");
    return SampledSpectrum(0);
#else
    if (!mipmap)
        return SampledSpectrum(scale);
    Vector2f dstdx, dstdy;
    Point2f st = mapping.Map(ctx, &dstdx, &dstdy);
    // Texture coordinates are (0,0) in the lower left corner, but
    // image coordinates are (0,0) in the upper left.
    st[1] = 1 - st[1];
    RGB rgb = scale * mipmap->Lookup<RGB>(st, dstdx, dstdy);
    const RGBColorSpace *cs = mipmap->GetRGBColorSpace();
    if (cs != nullptr) {
        if (std::max({rgb.r, rgb.g, rgb.b}) > 1)
            return RGBSpectrum(*cs, rgb).Sample(lambda);
        return RGBReflectanceSpectrum(*cs, rgb).Sample(lambda);
    }
    // otherwise it better be a one-channel texture
    CHECK(rgb[0] == rgb[1] && rgb[1] == rgb[2]);
    return SampledSpectrum(rgb[0]);
#endif
}